

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis<double,int,long_double>
                 (size_t col_num,size_t nrows,double *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble in_ST3;
  size_t local_c8;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  
  iVar1 = Xc_indptr[col_num];
  lVar4 = (long)iVar1;
  iVar2 = Xc_indptr[col_num + 1];
  if (1 < nrows && iVar2 != iVar1) {
    local_c8 = nrows;
    if (missing_action == Fail) {
      if (iVar2 <= iVar1) {
        return -INFINITY;
      }
      lVar11 = (longdouble)0;
      do {
        lVar8 = in_ST2;
        lVar7 = in_ST1;
        lVar6 = in_ST0;
        lVar11 = lVar11 + (longdouble)Xc[lVar4];
        in_ST1 = in_ST3;
        in_ST2 = in_ST3;
        lVar5 = in_ST3;
        fmal();
        fmal();
        fmal();
        lVar4 = lVar4 + 1;
        in_ST0 = in_ST3;
        in_ST3 = lVar5;
      } while (iVar2 != lVar4);
    }
    else {
      lVar11 = (longdouble)0;
      lVar6 = lVar11;
      lVar7 = lVar11;
      lVar8 = lVar11;
      if (iVar1 < iVar2) {
        lVar11 = (longdouble)0;
        lVar6 = lVar11;
        lVar7 = lVar11;
        lVar8 = lVar11;
        do {
          lVar5 = (longdouble)Xc[lVar4];
          local_58 = SUB108(lVar5,0);
          uStack_50 = (ushort)((unkuint10)lVar5 >> 0x40);
          if ((NAN(Xc[lVar4])) || ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000)) {
            local_c8 = local_c8 - 1;
          }
          else {
            lVar11 = lVar11 + lVar5;
            lVar8 = in_ST1;
            lVar5 = in_ST1;
            lVar9 = in_ST1;
            fmal();
            fmal();
            fmal();
            lVar6 = in_ST0;
            lVar7 = in_ST1;
            in_ST0 = lVar5;
            in_ST1 = lVar9;
          }
          lVar4 = lVar4 + 1;
        } while (iVar2 != lVar4);
      }
      if (local_c8 <= nrows - (long)(iVar2 - iVar1)) {
        return -INFINITY;
      }
    }
    if (1 < local_c8) {
      if ((lVar6 != (longdouble)0) || (NAN(lVar6) || NAN((longdouble)0))) {
        if ((lVar6 != lVar11 * lVar11) || (NAN(lVar6) || NAN(lVar11 * lVar11))) {
          lVar5 = (longdouble)(long)local_c8 +
                  (longdouble)(float)(&DAT_0036e0d8)[(long)local_c8 < 0];
          lVar9 = lVar11 / lVar5;
          lVar10 = lVar9 * lVar9;
          lVar12 = lVar6 / lVar5 - lVar10;
          if ((!NAN(lVar12)) &&
             (((longdouble)2.220446e-16 < lVar12 ||
              (bVar3 = check_more_than_two_unique_values<double,int>
                                 (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar3)))) {
            if (lVar12 <= (longdouble)0) {
              return 0.0;
            }
            lVar11 = (lVar9 * lVar10 * lVar9 * lVar5 +
                     lVar11 * (longdouble)-4.0 * lVar10 * lVar9 +
                     lVar6 * (longdouble)6.0 * lVar10 + lVar7 * (longdouble)-4.0 * lVar9 + lVar8) /
                     (lVar12 * lVar12 * lVar5);
            uStack_60 = (ushort)((unkuint10)lVar11 >> 0x40);
            local_68 = SUB108(lVar11,0);
            if (((unkuint10)lVar11 & 0x7fff) == 0 ||
                (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
              if ((double)lVar11 <= 0.0) {
                return 0.0;
              }
              return (double)lVar11;
            }
            return -INFINITY;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}